

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_parse_url_path(connectdata *conn)

{
  char *pcVar1;
  char *local_58;
  char *local_48;
  char *slash;
  char *path;
  smb_conn *smbc;
  smb_request *req;
  Curl_easy *data;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  req = (smb_request *)conn->data;
  smbc = (smb_conn *)(((Curl_easy *)req)->req).protop;
  path = (char *)&conn->proto;
  pcStack_18 = conn;
  data._4_4_ = Curl_urldecode((Curl_easy *)req,(((Curl_easy *)req)->state).up.path,0,&slash,
                              (size_t *)0x0,true);
  conn_local._4_4_ = data._4_4_;
  if (data._4_4_ == CURLE_OK) {
    if ((*slash == '/') || (*slash == '\\')) {
      local_58 = slash + 1;
    }
    else {
      local_58 = slash;
    }
    pcVar1 = (*Curl_cstrdup)(local_58);
    *(char **)(path + 0x18) = pcVar1;
    (*Curl_cfree)(slash);
    if (*(long *)(path + 0x18) == 0) {
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      local_48 = strchr(*(char **)(path + 0x18),0x2f);
      if (local_48 == (char *)0x0) {
        local_48 = strchr(*(char **)(path + 0x18),0x5c);
      }
      if (local_48 == (char *)0x0) {
        (*Curl_cfree)(*(void **)(path + 0x18));
        path[0x18] = '\0';
        path[0x19] = '\0';
        path[0x1a] = '\0';
        path[0x1b] = '\0';
        path[0x1c] = '\0';
        path[0x1d] = '\0';
        path[0x1e] = '\0';
        path[0x1f] = '\0';
        conn_local._4_4_ = CURLE_URL_MALFORMAT;
      }
      else {
        *local_48 = '\0';
        smbc->user = local_48 + 1;
        for (local_48 = local_48 + 1; *local_48 != '\0'; local_48 = local_48 + 1) {
          if (*local_48 == '/') {
            *local_48 = '\\';
          }
        }
        conn_local._4_4_ = CURLE_OK;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_parse_url_path(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct smb_request *req = data->req.protop;
  struct smb_conn *smbc = &conn->proto.smbc;
  char *path;
  char *slash;

  /* URL decode the path */
  result = Curl_urldecode(data, data->state.up.path, 0, &path, NULL, TRUE);
  if(result)
    return result;

  /* Parse the path for the share */
  smbc->share = strdup((*path == '/' || *path == '\\') ? path + 1 : path);
  free(path);
  if(!smbc->share)
    return CURLE_OUT_OF_MEMORY;

  slash = strchr(smbc->share, '/');
  if(!slash)
    slash = strchr(smbc->share, '\\');

  /* The share must be present */
  if(!slash) {
    Curl_safefree(smbc->share);
    return CURLE_URL_MALFORMAT;
  }

  /* Parse the path for the file path converting any forward slashes into
     backslashes */
  *slash++ = 0;
  req->path = slash;

  for(; *slash; slash++) {
    if(*slash == '/')
      *slash = '\\';
  }
  return CURLE_OK;
}